

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_converter.hpp
# Opt level: O0

string * __thiscall
trial::protocol::json::detail::string_converter<char,double>::encode_abi_cxx11_
          (string *__return_storage_ptr__,string_converter<char,double> *this,double value)

{
  ostream *poVar1;
  allocator<char> local_1d9;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1d8;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1d0;
  string local_1c8 [8];
  string work;
  locale local_198 [8];
  ostringstream local_190 [8];
  ostringstream stream;
  double value_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  std::locale::classic();
  std::ios::imbue(local_198);
  std::locale::~locale(local_198);
  poVar1 = (ostream *)std::ostream::operator<<(local_190,std::showpoint);
  work.field_2._8_4_ = std::setprecision(0xf);
  poVar1 = std::operator<<(poVar1,(_Setprecision)work.field_2._8_4_);
  std::ostream::operator<<(poVar1,value);
  std::__cxx11::ostringstream::str();
  local_1d0._M_current = (char *)std::__cxx11::string::begin();
  local_1d8._M_current = (char *)std::__cxx11::string::end();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,void>
            ((string *)__return_storage_ptr__,local_1d0,local_1d8,&local_1d9);
  std::allocator<char>::~allocator(&local_1d9);
  std::__cxx11::string::~string(local_1c8);
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return __return_storage_ptr__;
}

Assistant:

static string encode(double value)
    {
        // Workaround for CharT = unsigned char, which std::locale does not support
        std::ostringstream stream;
        stream.imbue(std::locale::classic());
        stream << std::showpoint << std::setprecision(std::numeric_limits<double>::digits10) << value;
        std::string work = stream.str();
        return {work.begin(), work.end()};
    }